

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_vertex_color(void *attr,float *vals,nk_draw_vertex_layout_format format)

{
  nk_color nVar1;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  nk_color local_ac;
  nk_color local_a8;
  float local_a4;
  nk_uint local_a0;
  nk_color local_9c;
  nk_uint color;
  nk_color col_7;
  double col_6 [4];
  nk_uint col_5 [4];
  undefined4 local_60;
  undefined4 local_5c;
  nk_uint col_4 [3];
  nk_ushort col_3 [4];
  nk_ushort col_2 [3];
  nk_color bgra;
  nk_color col_1;
  nk_color col;
  float val [4];
  nk_draw_vertex_layout_format format_local;
  float *vals_local;
  void *attr_local;
  
  if (format < NK_FORMAT_COLOR_BEGIN) {
    __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x2509,
                  "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                 );
  }
  if (NK_FORMAT_COLOR_END < format) {
    __assert_fail("format <= NK_FORMAT_COLOR_END",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x250a,
                  "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                 );
  }
  if ((NK_FORMAT_DOUBLE < format) && (format < NK_FORMAT_COUNT)) {
    if (*vals <= 1.0) {
      local_a4 = *vals;
    }
    else {
      local_a4 = 1.0;
    }
    if (local_a4 <= 0.0) {
      local_ac.r = '\0';
      local_ac.g = '\0';
      local_ac.b = '\0';
      local_ac.a = '\0';
    }
    else {
      if (*vals <= 1.0) {
        local_a8 = (nk_color)*vals;
      }
      else {
        local_a8.r = '\0';
        local_a8.g = '\0';
        local_a8.b = 0x80;
        local_a8.a = '?';
      }
      local_ac = local_a8;
    }
    col_1 = local_ac;
    if (vals[1] <= 1.0) {
      local_b0 = vals[1];
    }
    else {
      local_b0 = 1.0;
    }
    if (local_b0 <= 0.0) {
      local_b8 = 0.0;
    }
    else {
      if (vals[1] <= 1.0) {
        local_b4 = vals[1];
      }
      else {
        local_b4 = 1.0;
      }
      local_b8 = local_b4;
    }
    if (vals[2] <= 1.0) {
      local_bc = vals[2];
    }
    else {
      local_bc = 1.0;
    }
    if (local_bc <= 0.0) {
      local_c4 = 0.0;
    }
    else {
      if (vals[2] <= 1.0) {
        local_c0 = vals[2];
      }
      else {
        local_c0 = 1.0;
      }
      local_c4 = local_c0;
    }
    if (vals[3] <= 1.0) {
      local_c8 = vals[3];
    }
    else {
      local_c8 = 1.0;
    }
    if (local_c8 <= 0.0) {
      local_d0 = 0.0;
    }
    else {
      if (vals[3] <= 1.0) {
        local_cc = vals[3];
      }
      else {
        local_cc = 1.0;
      }
      local_d0 = local_cc;
    }
    switch(format) {
    case NK_FORMAT_COLOR_BEGIN:
    case NK_FORMAT_R8G8B8A8:
      bgra = nk_rgba_fv((float *)&col_1);
      nk_memcopy(attr,&bgra,4);
      break;
    case NK_FORMAT_R16G15B16:
      col_3[0] = (nk_ushort)(int)((float)local_ac * 65535.0);
      col_3[1] = (nk_ushort)(int)(local_b8 * 65535.0);
      col_3[2] = (nk_ushort)(int)(local_c4 * 65535.0);
      nk_memcopy(attr,col_3,6);
      break;
    case NK_FORMAT_R32G32B32:
      local_60 = (undefined4)(long)((float)local_ac * 4.2949673e+09);
      local_5c = (undefined4)(long)(local_b8 * 4.2949673e+09);
      col_4[0] = (nk_uint)(long)(local_c4 * 4.2949673e+09);
      nk_memcopy(attr,&local_60,0xc);
      break;
    case NK_FORMAT_B8G8R8A8:
      nVar1 = nk_rgba_fv((float *)&col_1);
      register0x00000000 =
           nk_rgba((uint)nVar1 >> 0x10 & 0xff,(uint)nVar1 >> 8 & 0xff,(uint)nVar1 & 0xff,
                   (uint)nVar1 >> 0x18);
      nk_memcopy(attr,col_3 + 3,4);
      break;
    case NK_FORMAT_R16G15B16A16:
      col_4[1]._2_2_ = (undefined2)(int)((float)local_ac * 65535.0);
      col_4[2]._0_2_ = (undefined2)(int)(local_b8 * 65535.0);
      col_4[2]._2_2_ = (undefined2)(int)(local_c4 * 65535.0);
      nk_memcopy(attr,(void *)((long)col_4 + 6),8);
      break;
    case NK_FORMAT_R32G32B32A32:
      col_6[3]._0_4_ = (undefined4)(long)((float)local_ac * 4.2949673e+09);
      col_6[3]._4_4_ = (undefined4)(long)(local_b8 * 4.2949673e+09);
      nk_memcopy(attr,col_6 + 3,0x10);
      break;
    case NK_FORMAT_R32G32B32A32_FLOAT:
      nk_memcopy(attr,&col_1,0x10);
      break;
    case NK_FORMAT_R32G32B32A32_DOUBLE:
      _color = (double)(float)local_ac;
      col_6[0] = (double)local_b8;
      col_6[1] = (double)local_c4;
      col_6[2] = (double)local_d0;
      nk_memcopy(attr,&color,0x20);
      break;
    case NK_FORMAT_RGB32:
    case NK_FORMAT_COLOR_END:
      local_9c = nk_rgba_fv((float *)&col_1);
      local_a0 = nk_color_u32(local_9c);
      nk_memcopy(attr,&local_a0,4);
      break;
    default:
      __assert_fail("0 && \"Invalid vertex layout color format\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x2513,
                    "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                   );
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_vertex_color(void *attr, const float *vals,
    enum nk_draw_vertex_layout_format format)
{
    /* if this triggers you tried to provide a value format for a color */
    float val[4];
    NK_ASSERT(format >= NK_FORMAT_COLOR_BEGIN);
    NK_ASSERT(format <= NK_FORMAT_COLOR_END);
    if (format < NK_FORMAT_COLOR_BEGIN || format > NK_FORMAT_COLOR_END) return;

    val[0] = NK_SATURATE(vals[0]);
    val[1] = NK_SATURATE(vals[1]);
    val[2] = NK_SATURATE(vals[2]);
    val[3] = NK_SATURATE(vals[3]);

    switch (format) {
    default: NK_ASSERT(0 && "Invalid vertex layout color format"); break;
    case NK_FORMAT_R8G8B8A8:
    case NK_FORMAT_R8G8B8: {
        struct nk_color col = nk_rgba_fv(val);
        NK_MEMCPY(attr, &col.r, sizeof(col));
    } break;
    case NK_FORMAT_B8G8R8A8: {
        struct nk_color col = nk_rgba_fv(val);
        struct nk_color bgra = nk_rgba(col.b, col.g, col.r, col.a);
        NK_MEMCPY(attr, &bgra, sizeof(bgra));
    } break;
    case NK_FORMAT_R16G15B16: {
        nk_ushort col[3];
        col[0] = (nk_ushort)(val[0]*(float)NK_USHORT_MAX);
        col[1] = (nk_ushort)(val[1]*(float)NK_USHORT_MAX);
        col[2] = (nk_ushort)(val[2]*(float)NK_USHORT_MAX);
        NK_MEMCPY(attr, col, sizeof(col));
    } break;
    case NK_FORMAT_R16G15B16A16: {
        nk_ushort col[4];
        col[0] = (nk_ushort)(val[0]*(float)NK_USHORT_MAX);
        col[1] = (nk_ushort)(val[1]*(float)NK_USHORT_MAX);
        col[2] = (nk_ushort)(val[2]*(float)NK_USHORT_MAX);
        col[3] = (nk_ushort)(val[3]*(float)NK_USHORT_MAX);
        NK_MEMCPY(attr, col, sizeof(col));
    } break;
    case NK_FORMAT_R32G32B32: {
        nk_uint col[3];
        col[0] = (nk_uint)(val[0]*(float)NK_UINT_MAX);
        col[1] = (nk_uint)(val[1]*(float)NK_UINT_MAX);
        col[2] = (nk_uint)(val[2]*(float)NK_UINT_MAX);
        NK_MEMCPY(attr, col, sizeof(col));
    } break;
    case NK_FORMAT_R32G32B32A32: {
        nk_uint col[4];
        col[0] = (nk_uint)(val[0]*(float)NK_UINT_MAX);
        col[1] = (nk_uint)(val[1]*(float)NK_UINT_MAX);
        col[2] = (nk_uint)(val[2]*(float)NK_UINT_MAX);
        col[3] = (nk_uint)(val[3]*(float)NK_UINT_MAX);
        NK_MEMCPY(attr, col, sizeof(col));
    } break;
    case NK_FORMAT_R32G32B32A32_FLOAT:
        NK_MEMCPY(attr, val, sizeof(float)*4);
        break;
    case NK_FORMAT_R32G32B32A32_DOUBLE: {
        double col[4];
        col[0] = (double)val[0];
        col[1] = (double)val[1];
        col[2] = (double)val[2];
        col[3] = (double)val[3];
        NK_MEMCPY(attr, col, sizeof(col));
    } break;
    case NK_FORMAT_RGB32:
    case NK_FORMAT_RGBA32: {
        struct nk_color col = nk_rgba_fv(val);
        nk_uint color = nk_color_u32(col);
        NK_MEMCPY(attr, &color, sizeof(color));
    } break; }
}